

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_constructor.c
# Opt level: O0

constructor constructor_create(size_t count,class_visibility_id visibility)

{
  set psVar1;
  class_visibility_id in_ESI;
  constructor in_RDI;
  constructor_node node;
  size_t index;
  constructor ctor;
  constructor_node in_stack_ffffffffffffffd0;
  set_cb_hash in_stack_ffffffffffffffd8;
  constructor ctor_00;
  constructor local_8;
  
  local_8 = (constructor)malloc((long)in_RDI * 0x18 + 0x18);
  if (local_8 == (constructor)0x0) {
    local_8 = (constructor)0x0;
  }
  else {
    psVar1 = set_create(in_stack_ffffffffffffffd8,(set_cb_compare)in_stack_ffffffffffffffd0);
    local_8->map = psVar1;
    if (local_8->map == (set)0x0) {
      log_write_impl_va("metacall",0x59,"constructor_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_constructor.c"
                        ,LOG_LEVEL_ERROR,"Invalid constructor set allocation");
      free(local_8);
      local_8 = (constructor)0x0;
    }
    else {
      local_8->count = (size_t)in_RDI;
      for (ctor_00 = (constructor)0x0; ctor_00 < in_RDI;
          ctor_00 = (constructor)((long)&ctor_00->visibility + 1)) {
        in_stack_ffffffffffffffd0 = constructor_at(ctor_00,(size_t)in_stack_ffffffffffffffd0);
        if (in_stack_ffffffffffffffd0 != (constructor_node)0x0) {
          in_stack_ffffffffffffffd0->index = 0xffffffffffffffff;
          in_stack_ffffffffffffffd0->name = (char *)0x0;
          in_stack_ffffffffffffffd0->t = (type)0x0;
        }
      }
      local_8->visibility = in_ESI;
    }
  }
  return local_8;
}

Assistant:

constructor constructor_create(size_t count, enum class_visibility_id visibility)
{
	constructor ctor = malloc(sizeof(struct constructor_type) + sizeof(struct constructor_node_type) * count);

	if (ctor != NULL)
	{
		size_t index;

		ctor->map = set_create(&hash_callback_str, &comparable_callback_str);

		if (ctor->map == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid constructor set allocation");

			free(ctor);

			return NULL;
		}

		ctor->count = count;

		for (index = 0; index < count; ++index)
		{
			constructor_node node = constructor_at(ctor, index);

			if (node != NULL)
			{
				node->index = REFLECT_CONSTRUCTOR_INVALID_INDEX;
				node->name = NULL;
				node->t = NULL;
			}
		}

		ctor->visibility = visibility;

		return ctor;
	}

	return NULL;
}